

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.h
# Opt level: O0

void __thiscall thread_pool::thread_pool(thread_pool *this,size_t n)

{
  size_type __n;
  type local_58;
  thread local_50;
  ulong local_48;
  size_t i;
  unique_lock<std::mutex> lock;
  allocator<std::thread> local_19;
  size_type local_18;
  size_t n_local;
  thread_pool *this_local;
  
  local_18 = n;
  n_local = (size_t)this;
  std::atomic<bool>::atomic(&this->m_running,true);
  __n = local_18;
  std::allocator<std::thread>::allocator(&local_19);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector(&this->m_threads,__n,&local_19);
  std::allocator<std::thread>::~allocator(&local_19);
  std::mutex::mutex(&this->m_mutex);
  std::condition_variable::condition_variable(&this->m_cv);
  std::condition_variable::condition_variable(&this->m_cvWait);
  std::
  queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>
  ::queue<std::deque<std::function<void()>,std::allocator<std::function<void()>>>,void>
            ((queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>
              *)&this->m_work);
  this->m_doingWork = 0;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&i,&this->m_mutex);
  for (local_48 = 0; local_48 < local_18; local_48 = local_48 + 1) {
    local_58.this = this;
    std::thread::thread<thread_pool::thread_pool(unsigned_long)::_lambda()_1_,,void>
              (&local_50,&local_58);
    std::vector<std::thread,_std::allocator<std::thread>_>::push_back(&this->m_threads,&local_50);
    std::thread::~thread(&local_50);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&i);
  return;
}

Assistant:

thread_pool(const size_t n)
    : m_running(true)
    , m_threads(n)
    , m_doingWork(0)
  {
    std::unique_lock<std::mutex> lock(m_mutex);
    for (size_t i=0; i<n; ++i)
      m_threads.push_back(std::move(std::thread([this]{ worker(); })));
  }